

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcmake.cpp
# Opt level: O2

CTcMakePath * __thiscall CTcMake::add_sys_include_path(CTcMake *this,textchar_t *path)

{
  CTcMakePath *this_00;
  CTcMakePath **ppCVar1;
  
  this_00 = (CTcMakePath *)operator_new(0x10);
  CTcMakePath::CTcMakePath(this_00,path);
  ppCVar1 = &this->inc_tail_->nxt_;
  if (this->inc_tail_ == (CTcMakePath *)0x0) {
    ppCVar1 = &this->inc_head_;
  }
  *ppCVar1 = this_00;
  this->inc_tail_ = this_00;
  this_00->nxt_ = (CTcMakePath *)0x0;
  return this_00;
}

Assistant:

CTcMakePath *CTcMake::add_sys_include_path(const textchar_t *path)
{
    CTcMakePath *inc;

    /* create the entry */
    inc = new CTcMakePath(path);

    /* add it at the end of our list */
    if (inc_tail_ != 0)
        inc_tail_->set_next(inc);
    else
        inc_head_ = inc;
    inc_tail_ = inc;
    inc->set_next(0);

    /* return the new path object */
    return inc;
}